

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

GLuint ShaderProgramCompile(string *src,GLenum type,string *error)

{
  GLchar local_1fe8 [8];
  char info [8096];
  GLint local_3c;
  GLchar *pGStack_38;
  GLint length;
  GLchar *source;
  GLuint shader;
  GLint compile_status;
  string *error_local;
  string *psStack_18;
  GLenum type_local;
  string *src_local;
  
  _shader = error;
  error_local._4_4_ = type;
  psStack_18 = src;
  source._0_4_ = (*glad_glCreateShader)(type);
  pGStack_38 = (GLchar *)std::__cxx11::string::c_str();
  (*glad_glShaderSource)((GLuint)source,1,&stack0xffffffffffffffc8,(GLint *)0x0);
  (*glad_glCompileShader)((GLuint)source);
  (*glad_glGetShaderiv)((GLuint)source,0x8b81,(GLint *)((long)&source + 4));
  if (source._4_4_ == 0) {
    local_3c = 0;
    (*glad_glGetShaderiv)((GLuint)source,0x8b84,&local_3c);
    (*glad_glGetShaderInfoLog)((GLuint)source,local_3c,(GLsizei *)0x0,local_1fe8);
    std::__cxx11::string::operator=((string *)_shader,local_1fe8);
    (*glad_glDeleteShader)((GLuint)source);
    src_local._4_4_ = 0;
  }
  else {
    src_local._4_4_ = (GLuint)source;
  }
  return src_local._4_4_;
}

Assistant:

GLuint ShaderProgramCompile(const std::string src, GLenum type, std::string& error) {
    GLint compile_status;
    GLuint shader = glCreateShader(type);
    const GLchar* source = (const GLchar*) src.c_str();

    glShaderSource(shader, 1, &source, NULL);
    glCompileShader(shader);
    glGetShaderiv(shader, GL_COMPILE_STATUS, &compile_status);

    if (!compile_status) {
        GLint length = 0;
        glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &length);
        
        char info[8096];
        glGetShaderInfoLog(shader, length, NULL, info);
        
        error = info;

        glDeleteShader(shader);
        return 0;
    }

    return shader;
}